

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_innerproduct_dropout(NetOptimize *this)

{
  float fVar1;
  int iVar2;
  value_type pLVar3;
  value_type pLVar4;
  size_type sVar5;
  pointer pMVar6;
  bool bVar7;
  int iVar8;
  size_type sVar9;
  reference ppLVar10;
  reference pvVar11;
  size_type sVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  reference pvVar16;
  long in_RDI;
  int top_blob_index_final;
  int i_2;
  float *bias;
  int j_1;
  float *conv_weight_outch;
  int i_1;
  float *weight;
  int weight_per_outch;
  int num_output;
  float scale;
  Dropout *dropout;
  InnerProduct *innerproduct;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  FILE *in_stack_ffffffffffffff60;
  int local_84;
  int local_74;
  int local_64;
  size_type local_38;
  size_type local_28;
  
  sVar9 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_28 = 0;
  do {
    if (sVar9 <= local_28) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_28);
    bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff60,
                            (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (!bVar7) {
      ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_28);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar10)->tops,0);
      iVar2 = *pvVar11;
      local_38 = local_28;
      do {
        do {
          do {
            local_38 = local_38 + 1;
            if (sVar9 <= local_38) goto LAB_0017dc4d;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_38);
            bVar7 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff60,
                                    (char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                     in_stack_ffffffffffffff58));
          } while (bVar7);
          ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_38);
          sVar12 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar10)->bottoms);
        } while (sVar12 != 1);
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_38);
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar10)->bottoms,0);
      } while (*pvVar11 != iVar2);
LAB_0017dc4d:
      if (local_38 != sVar9) {
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_28);
        pLVar3 = *ppLVar10;
        ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_38);
        pLVar4 = *ppLVar10;
        in_stack_ffffffffffffff60 = _stderr;
        uVar13 = std::__cxx11::string::c_str();
        uVar14 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffff60,"fuse_innerproduct_dropout %s %s\n",uVar13,uVar14);
        fVar1 = *(float *)&pLVar4[1]._vptr_Layer;
        if ((fVar1 != 1.0) || (NAN(fVar1))) {
          iVar2 = *(int *)&pLVar3[1]._vptr_Layer;
          iVar8 = *(int *)&pLVar3[1].one_blob_only / iVar2;
          sVar5 = pLVar3[1].name.field_2._M_allocated_capacity;
          for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
            lVar15 = sVar5 + (long)(iVar8 * local_64) * 4;
            for (local_74 = 0; local_74 < iVar8; local_74 = local_74 + 1) {
              *(float *)(lVar15 + (long)local_74 * 4) =
                   fVar1 * *(float *)(lVar15 + (long)local_74 * 4);
            }
          }
          if (*(int *)((long)&pLVar3[1]._vptr_Layer + 4) != 0) {
            pMVar6 = pLVar3[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (local_84 = 0; local_84 < iVar2; local_84 = local_84 + 1) {
              *(float *)((long)&pMVar6->data + (long)local_84 * 4) =
                   fVar1 * *(float *)((long)&pMVar6->data + (long)local_84 * 4);
            }
          }
        }
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
        iVar2 = *pvVar11;
        in_stack_ffffffffffffff58 = iVar2;
        pvVar11 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,0);
        *pvVar11 = in_stack_ffffffffffffff58;
        in_stack_ffffffffffffff5c = (int)local_28;
        pvVar16 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             (long)iVar2);
        pvVar16->producer = in_stack_ffffffffffffff5c;
        std::__cxx11::string::operator=((string *)&pLVar4->type,"ncnnfused");
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_dropout()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - Dropout
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Dropout")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - Dropout to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::Dropout* dropout = (ncnn::Dropout*)layers[j];

        fprintf(stderr, "fuse_innerproduct_dropout %s %s\n", innerproduct->name.c_str(), dropout->name.c_str());

        float scale = dropout->scale;
        if (scale != 1.f)
        {
            const int num_output = innerproduct->num_output;
            const int weight_per_outch = innerproduct->weight_data_size / num_output;

            float* weight = innerproduct->weight_data;
            for (int i = 0; i < num_output; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j = 0; j < weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= scale;
                }
            }

            if (innerproduct->bias_term)
            {
                float* bias = innerproduct->bias_data;
                for (int i = 0; i < num_output; i++)
                {
                    bias[i] *= scale;
                }
            }
        }

        int top_blob_index_final = dropout->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        dropout->type = "ncnnfused";
    }

    return 0;
}